

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SupermapException.cpp
# Opt level: O2

void __thiscall
supermap::NotImplementedException::NotImplementedException
          (NotImplementedException *this,string *message)

{
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  std::operator+(&local_70,&local_90,"NotImplementedException");
  __rhs = ": ";
  if (message->_M_string_length == 0) {
    __rhs = "";
  }
  std::operator+(&local_50,&local_70,__rhs);
  std::operator+(&local_30,&local_50,message);
  SupermapException::SupermapException(&this->super_SupermapException,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  *(undefined ***)&this->super_SupermapException = &PTR__logic_error_0010e948;
  return;
}

Assistant:

NotImplementedException::NotImplementedException(const std::string &message)
    : SupermapException(std::string() + "NotImplementedException" + (message.empty() ? "" : ": ") + message) {}